

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptor::GetLocationPath
          (MethodDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int local_18 [2];
  
  ServiceDescriptor::GetLocationPath(this->service_,output);
  local_18[1] = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,local_18 + 1);
  local_18[0] = (int)(((long)this - (long)this->service_->methods_) / 0x50);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,local_18);
  return;
}

Assistant:

void MethodDescriptor::GetLocationPath(std::vector<int>* output) const {
  service()->GetLocationPath(output);
  output->push_back(ServiceDescriptorProto::kMethodFieldNumber);
  output->push_back(index());
}